

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O0

void sysbvm_virtualMemory_freeSystemMemoryWithDualMapping
               (size_t sizeToFree,void *mappingHandle,void *writeableMapping,void *executableMapping
               )

{
  int fd;
  void *executableMapping_local;
  void *writeableMapping_local;
  void *mappingHandle_local;
  size_t sizeToFree_local;
  
  if (-1 < (int)mappingHandle) {
    munmap(writeableMapping,sizeToFree);
    munmap(executableMapping,sizeToFree);
    close((int)mappingHandle);
  }
  return;
}

Assistant:

void sysbvm_virtualMemory_freeSystemMemoryWithDualMapping(size_t sizeToFree, void *mappingHandle, void *writeableMapping, void *executableMapping)
{
    int fd = (intptr_t)mappingHandle;
    if(fd < 0)
        return;

    munmap(writeableMapping, sizeToFree);
    munmap(executableMapping, sizeToFree);
    close(fd);
}